

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall FlowGraph::VerifyLoopGraph(FlowGraph *this)

{
  Loop *this_00;
  code *pcVar1;
  NodeBase *pNVar2;
  bool bVar3;
  uint uVar4;
  uint functionId;
  BOOL BVar5;
  Loop *currentLoop;
  undefined4 *puVar6;
  Type *ppFVar7;
  BasicBlock *pBVar8;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  BasicBlock *pBVar9;
  Loop *pLVar10;
  char *message;
  Loop *pLVar11;
  char *error;
  BasicBlock *pBVar12;
  undefined1 local_48 [8];
  Iterator __iter;
  
  pBVar12 = this->blockList;
  if (pBVar12 == (BasicBlock *)0x0) {
    return;
  }
  __iter.current = (NodeBase *)this;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_004185d3:
  if ((pBVar12->field_0x18 & 1) == 0) {
    this_00 = pBVar12->loop;
    local_48 = (undefined1  [8])&pBVar12->succList;
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48;
LAB_004185f7:
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_00418921;
      *puVar6 = 0;
    }
    pNVar2 = __iter.current;
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_48) goto code_r0x00418651;
    ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_48);
    pBVar9 = (*ppFVar7)->succBlock;
    if (pBVar9 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xf6f,"(succ)","succ");
      if (!bVar3) goto LAB_00418921;
      *puVar6 = 0;
    }
    pLVar10 = pBVar9->loop;
    if (this_00 == pLVar10) goto LAB_0041873a;
    if ((*(ushort *)&pBVar9->field_0x18 & 4) != 0) {
      if (pLVar10->parent != this_00) {
        bVar3 = pLVar10 != (Loop *)0x0;
        if (pLVar10 != this_00 && bVar3) {
          do {
            pLVar10 = pLVar10->parent;
            bVar3 = pLVar10 != (Loop *)0x0;
            if (pLVar10 == this_00) break;
          } while (pLVar10 != (Loop *)0x0);
        }
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          uVar4 = 0xf79;
          error = "(succ->loop->parent == loop || (!loop->IsDescendentOrSelf(succ->loop)))";
          message = "succ->loop->parent == loop || (!loop->IsDescendentOrSelf(succ->loop))";
          goto LAB_004187ef;
        }
      }
      goto LAB_004185f7;
    }
    if (pLVar10 == (Loop *)0x0) goto LAB_004185f7;
    bVar3 = this_00 != (Loop *)0x0;
    if ((this_00 != (Loop *)0x0) && (pLVar11 = this_00, this_00 != pLVar10)) {
      do {
        pLVar11 = pLVar11->parent;
        bVar3 = pLVar11 != (Loop *)0x0;
        if (pLVar11 == pLVar10) break;
      } while (pLVar11 != (Loop *)0x0);
    }
    if (bVar3) goto LAB_004185f7;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    uVar4 = 0xf7c;
    error = "(succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop))";
    message = "succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop)";
    goto LAB_004187ef;
  }
  goto LAB_00418906;
code_r0x00418651:
  __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this_01 = JITTimeWorkItem::GetJITFunctionBody((JITTimeWorkItem *)__iter.current[10].next[4].next);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo((JITTimeWorkItem *)pNVar2[10].next[4].next);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,RemoveBreakBlockPhase,uVar4,functionId);
  if ((((!bVar3) && (this_00 != (Loop *)0x0)) && ((pBVar12->field_0x18 & 4) == 0)) &&
     ((BVar5 = Func::HasTry((Func *)__iter.current[10].next), pBVar9 = pBVar12, BVar5 == 0 ||
      (bVar3 = Func::DoOptimizeTry((Func *)__iter.current[10].next), bVar3)))) {
    do {
      pBVar9 = pBVar9->prev;
    } while ((pBVar9->field_0x18 & 1) != 0);
    pLVar10 = pBVar9->loop;
    bVar3 = pLVar10 != (Loop *)0x0;
    if (pLVar10 != this_00 && bVar3) {
      do {
        pLVar10 = pLVar10->parent;
        bVar3 = pLVar10 != (Loop *)0x0;
        if (pLVar10 == this_00) break;
      } while (pLVar10 != (Loop *)0x0);
    }
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xf84,"(loop->IsDescendentOrSelf(block->GetPrev()->loop))",
                         "loop->IsDescendentOrSelf(block->GetPrev()->loop)");
      if (!bVar3) {
LAB_00418921:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
LAB_00418906:
  pBVar12 = pBVar12->next;
  if (pBVar12 == (BasicBlock *)0x0) {
    return;
  }
  goto LAB_004185d3;
LAB_0041873a:
  if (((*(ushort *)&pBVar9->field_0x18 & 4) == 0) ||
     (pBVar8 = Loop::GetHeadBlock(this_00), pBVar8 == pBVar9)) goto LAB_004185f7;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar6 = 1;
  uVar4 = 0xf73;
  error = "(succ->isLoopHeader == false || loop->GetHeadBlock() == succ)";
  message = "succ->isLoopHeader == false || loop->GetHeadBlock() == succ";
LAB_004187ef:
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                     ,uVar4,error,message);
  if (!bVar3) goto LAB_00418921;
  *puVar6 = 0;
  goto LAB_004185f7;
}

Assistant:

FOREACH_BLOCK(block, this)
    {
        Loop *loop = block->loop;
        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (loop == succ->loop)
            {
                Assert(succ->isLoopHeader == false || loop->GetHeadBlock() == succ);
                continue;
            }
            if (succ->isLoopHeader)
            {
                Assert(succ->loop->parent == loop
                    || (!loop->IsDescendentOrSelf(succ->loop)));
                continue;
            }
            Assert(succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop));
        } NEXT_SUCCESSOR_BLOCK;

        if (!PHASE_OFF(Js::RemoveBreakBlockPhase, this->GetFunc()))
        {
            // Make sure all break blocks have been removed.
            if (loop && !block->isLoopHeader && !(this->func->HasTry() && !this->func->DoOptimizeTry()))
            {
                Assert(loop->IsDescendentOrSelf(block->GetPrev()->loop));
            }
        }
    }